

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Own<capnp::ClientHook> __thiscall
capnp::anon_unknown_0::MembranePipelineHook::getPipelinedCap
          (MembranePipelineHook *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  PipelineHook *pPVar1;
  RefOrVoid<capnp::MembranePolicy> policy;
  PipelineOp *in_RCX;
  ClientHook *extraout_RDX;
  PipelineOp *pPVar2;
  Own<capnp::ClientHook> OVar3;
  Own<capnp::ClientHook> local_38;
  PipelineOp *local_28;
  MembranePipelineHook *this_local;
  ArrayPtr<const_capnp::PipelineOp> ops_local;
  
  this_local = (MembranePipelineHook *)ops.size_;
  pPVar2 = ops.ptr;
  local_28 = pPVar2;
  ops_local.ptr = in_RCX;
  ops_local.size_ = (size_t)this;
  pPVar1 = kj::Own<capnp::PipelineHook>::operator->((Own<capnp::PipelineHook> *)(pPVar2 + 3));
  (*pPVar1->_vptr_PipelineHook[1])(&local_38,pPVar1,this_local,ops_local.ptr);
  policy = kj::Own<capnp::MembranePolicy>::operator*((Own<capnp::MembranePolicy> *)(pPVar2 + 5));
  membrane((anon_unknown_0 *)this,&local_38,policy,(bool)((char)pPVar2[7].type & GET_POINTER_FIELD))
  ;
  kj::Own<capnp::ClientHook>::~Own(&local_38);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
    return membrane(inner->getPipelinedCap(ops), *policy, reverse);
  }